

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchClass.c
# Opt level: O2

int Dch_ClassesRefineConst1Group(Dch_Cla_t *p,Vec_Ptr_t *vRoots,int fRecursive)

{
  Aig_Obj_t **pClass;
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pObj;
  ulong uVar3;
  Aig_Obj_t *pRepr;
  Vec_Ptr_t *p_00;
  long lVar4;
  int iVar5;
  
  if (vRoots->nSize != 0) {
    p->vClassNew->nSize = 0;
    for (iVar5 = 0; iVar5 < vRoots->nSize; iVar5 = iVar5 + 1) {
      pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(vRoots,iVar5);
      iVar1 = (*p->pFuncNodeIsConst)(p->pManData,pAVar2);
      if (iVar1 == 0) {
        Vec_PtrPush(p->vClassNew,pAVar2);
      }
    }
    iVar5 = p->vClassNew->nSize;
    if (iVar5 != 0) {
      p->nCands1 = p->nCands1 - iVar5;
      pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p->vClassNew,0);
      Aig_ObjSetRepr(p->pAig,pAVar2,(Aig_Obj_t *)0x0);
      p_00 = p->vClassNew;
      uVar3 = (ulong)p_00->nSize;
      if (uVar3 == 1) {
        return 1;
      }
      pClass = p->pMemClassesFree;
      p->pMemClassesFree = pClass + uVar3;
      for (lVar4 = 0; lVar4 < (int)uVar3; lVar4 = lVar4 + 1) {
        pObj = (Aig_Obj_t *)Vec_PtrEntry(p_00,(int)lVar4);
        pClass[lVar4] = pObj;
        pRepr = pAVar2;
        if (lVar4 == 0) {
          pRepr = (Aig_Obj_t *)0x0;
        }
        Aig_ObjSetRepr(p->pAig,pObj,pRepr);
        p_00 = p->vClassNew;
        uVar3 = (ulong)(uint)p_00->nSize;
      }
      Dch_ObjAddClass(p,pAVar2,pClass,(int)uVar3);
      if (fRecursive == 0) {
        return 1;
      }
      iVar5 = Dch_ClassesRefineOneClass(p,pAVar2,1);
      return iVar5 + 1;
    }
  }
  return 0;
}

Assistant:

int Dch_ClassesRefineConst1Group( Dch_Cla_t * p, Vec_Ptr_t * vRoots, int fRecursive )
{
    Aig_Obj_t * pObj, * pReprNew, ** ppClassNew;
    int i;
    if ( Vec_PtrSize(vRoots) == 0 )
        return 0;
    // collect the nodes to be refined
    Vec_PtrClear( p->vClassNew );
    Vec_PtrForEachEntry( Aig_Obj_t *, vRoots, pObj, i )
        if ( !p->pFuncNodeIsConst( p->pManData, pObj ) )
            Vec_PtrPush( p->vClassNew, pObj );
    // check if there is a new class
    if ( Vec_PtrSize(p->vClassNew) == 0 )
        return 0;
    p->nCands1 -= Vec_PtrSize(p->vClassNew);
    pReprNew = (Aig_Obj_t *)Vec_PtrEntry( p->vClassNew, 0 );
    Aig_ObjSetRepr( p->pAig, pReprNew, NULL );
    if ( Vec_PtrSize(p->vClassNew) == 1 )
        return 1;
    // create a new class composed of these nodes
    ppClassNew = p->pMemClassesFree;
    p->pMemClassesFree += Vec_PtrSize(p->vClassNew);
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vClassNew, pObj, i )
    {
        ppClassNew[i] = pObj;
        Aig_ObjSetRepr( p->pAig, pObj, i? pReprNew : NULL );
    }
    Dch_ObjAddClass( p, pReprNew, ppClassNew, Vec_PtrSize(p->vClassNew) );
    // refine them recursively
    if ( fRecursive )
        return 1 + Dch_ClassesRefineOneClass( p, pReprNew, 1 );
    return 1;
}